

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O2

bool __thiscall
magic_enum::detail::cmp_equal<magic_enum::detail::case_insensitive<std::equal_to<void>>&>
          (detail *this,string_view lhs,string_view rhs,case_insensitive<std::equal_to<void>_> *p)

{
  detail dVar1;
  detail *pdVar2;
  detail dVar3;
  detail dVar4;
  bool bVar5;
  
  if (this != (detail *)lhs._M_str) {
    return false;
  }
  pdVar2 = (detail *)0x0;
  do {
    bVar5 = this == pdVar2;
    if (bVar5) {
      return bVar5;
    }
    dVar3 = pdVar2[lhs._M_len];
    dVar1 = pdVar2[rhs._M_len];
    dVar4 = (detail)((char)dVar3 + ' ');
    if (0x19 < (byte)((char)dVar3 + 0xbfU)) {
      dVar4 = dVar3;
    }
    dVar3 = (detail)((char)dVar1 + ' ');
    if (0x19 < (byte)((char)dVar1 + 0xbfU)) {
      dVar3 = dVar1;
    }
    pdVar2 = pdVar2 + 1;
  } while (dVar4 == dVar3);
  return bVar5;
}

Assistant:

constexpr bool cmp_equal(string_view lhs, string_view rhs, [[maybe_unused]] BinaryPredicate&& p) noexcept(is_nothrow_invocable<BinaryPredicate>()) {
#if defined(_MSC_VER) && _MSC_VER < 1920 && !defined(__clang__)
  // https://developercommunity.visualstudio.com/content/problem/360432/vs20178-regression-c-failed-in-test.html
  // https://developercommunity.visualstudio.com/content/problem/232218/c-constexpr-string-view.html
  constexpr bool workaround = true;
#else
  constexpr bool workaround = false;
#endif

  if constexpr (!is_default_predicate<BinaryPredicate>() || workaround) {
    if (lhs.size() != rhs.size()) {
      return false;
    }

    const auto size = lhs.size();
    for (std::size_t i = 0; i < size; ++i) {
      if (!p(lhs[i], rhs[i])) {
        return false;
      }
    }

    return true;
  } else {
    return lhs == rhs;
  }
}